

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

UINT8 ym2608_read(void *chip,UINT8 a)

{
  byte bVar1;
  UINT8 UVar2;
  YM2608 *F2608;
  
  bVar1 = *(byte *)((long)chip + 0x22c);
  switch(a & 3) {
  case 0:
    return *(byte *)((long)chip + 0x22f) & 0x83;
  case 1:
    if (bVar1 < 0x10) {
      UVar2 = (**(code **)((long)chip + 0x668))(*(undefined8 *)((long)chip + 0x678),0);
      return UVar2;
    }
    return bVar1 == 0xff;
  case 2:
    return (*(byte *)((long)chip + 0x54b3) & 1) << 5 |
           (*(byte *)((long)chip + 0x54c9) | 0x80) & *(byte *)((long)chip + 0x22f);
  }
  if (bVar1 == 0xf) {
    return 0x80;
  }
  if (bVar1 == 8) {
    UVar2 = YM_DELTAT_ADPCM_Read((YM_DELTAT *)((long)chip + 0x5430));
    return UVar2;
  }
  return '\0';
}

Assistant:

UINT8 ym2608_read(void *chip,UINT8 a)
{
	YM2608 *F2608 = (YM2608 *)chip;
	UINT8 addr = F2608->OPN.ST.address;
	UINT8 ret = 0;

	switch( a&3 )
	{
	case 0: /* status 0 : YM2203 compatible */
		/* BUSY:x:x:x:x:x:FLAGB:FLAGA */
		ret = FM_STATUS_FLAG(&F2608->OPN.ST) & 0x83;
		break;

	case 1: /* status 0, ID  */
		if( addr < 16 ) ret = F2608->OPN.ST.SSG_funcs.read(F2608->OPN.ST.SSG_param, 0);
		else if(addr == 0xff) ret = 0x01; /* ID code */
		break;

	case 2: /* status 1 : status 0 + ADPCM status */
		/* BUSY : x : PCMBUSY : ZERO : BRDY : EOS : FLAGB : FLAGA */
		ret = (FM_STATUS_FLAG(&F2608->OPN.ST) & (F2608->flagmask|0x80)) | ((F2608->deltaT.PCM_BSY & 1)<<5) ;
		break;

	case 3:
		if(addr == 0x08)
		{
			ret = YM_DELTAT_ADPCM_Read(&F2608->deltaT);
		}
		else if(addr == 0x0f)
		{
			logerror("YM2608 A/D conversion is accessed but not implemented !\n");
			ret = 0x80; /* 2's complement PCM data - result from A/D conversion */
		}
		break;
	}
	return ret;
}